

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<false>>
           *this,undefined8 *state,long *next)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char_type *begin;
  uint uVar8;
  
  pcVar1 = (char *)*state;
  uVar8 = *(uint *)(this + 0x28);
  if (uVar8 != 0) {
    pcVar5 = *(char **)this;
    pcVar2 = *(char **)(this + 0x20);
    uVar7 = 0;
    pcVar6 = pcVar5;
    pcVar3 = pcVar1;
    do {
      for (; pcVar6 != pcVar2; pcVar6 = pcVar6 + 1) {
        if (pcVar3 == (char *)state[4]) goto LAB_0012f9ea;
        if (*pcVar3 != *pcVar6) goto LAB_0012f9ee;
        *state = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
      }
      uVar7 = uVar7 + 1;
      pcVar6 = pcVar5;
    } while (uVar7 != uVar8);
  }
  cVar4 = (**(code **)(*next + 0x10))(next,state);
  while( true ) {
    if (cVar4 != '\0') {
      return true;
    }
    if (*(uint *)(this + 0x2c) <= uVar8) break;
    pcVar5 = *(char **)this;
    pcVar2 = *(char **)(this + 0x20);
    if (pcVar5 != pcVar2) {
      pcVar6 = (char *)*state;
      do {
        if (pcVar6 == (char *)state[4]) goto LAB_0012f9ea;
        if (*pcVar6 != *pcVar5) goto LAB_0012f9ee;
        pcVar5 = pcVar5 + 1;
        pcVar6 = pcVar6 + 1;
        *state = pcVar6;
      } while (pcVar5 != pcVar2);
    }
    uVar8 = uVar8 + 1;
    cVar4 = (**(code **)(*next + 0x10))(next,state);
  }
LAB_0012f9ee:
  *state = pcVar1;
  return false;
LAB_0012f9ea:
  *(undefined1 *)((long)state + 0x31) = 1;
  goto LAB_0012f9ee;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }